

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void __thiscall deqp::gls::QuadGrid::~QuadGrid(QuadGrid *this)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_18;
  QuadGrid *this_local;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->m_indices);
  local_18 = (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &this->m_indices;
  do {
    local_18 = local_18 + -1;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector(local_18);
  } while (local_18 != this->m_userAttribs);
  std::vector<float,_std::allocator<float>_>::~vector(&this->m_attribOne);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            (&this->m_unitCoords);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            (&this->m_coords);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            (&this->m_positions);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            (&this->m_screenPos);
  std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::~vector
            (&this->m_textures);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::~vector
            (&this->m_userAttribTransforms);
  return;
}

Assistant:

QuadGrid::~QuadGrid (void)
{
}